

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O0

int32_t __thiscall icu_63::JapaneseCalendar::handleGetExtendedYear(JapaneseCalendar *this)

{
  EraRules *this_00;
  UCalendarDateFields UVar1;
  int32_t iVar2;
  int32_t iVar3;
  UErrorCode local_18;
  int32_t eraStartYear;
  UErrorCode status;
  int32_t year;
  JapaneseCalendar *this_local;
  
  _status = this;
  UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if ((UVar1 == UCAL_EXTENDED_YEAR) &&
     (UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_ERA),
     UVar1 == UCAL_EXTENDED_YEAR)) {
    iVar2 = Calendar::internalGet((Calendar *)this,UCAL_EXTENDED_YEAR,0x7b2);
    return iVar2;
  }
  this_00 = gJapaneseEraRules;
  local_18 = U_ZERO_ERROR;
  iVar2 = Calendar::internalGet((Calendar *)this,UCAL_ERA,gCurrentEra);
  iVar2 = EraRules::getStartYear(this_00,iVar2,&local_18);
  iVar3 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,1);
  return iVar3 + iVar2 + -1;
}

Assistant:

int32_t JapaneseCalendar::handleGetExtendedYear()
{
    // EXTENDED_YEAR in JapaneseCalendar is a Gregorian year
    // The default value of EXTENDED_YEAR is 1970 (Showa 45)
    int32_t year;

    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR &&
        newerField(UCAL_EXTENDED_YEAR, UCAL_ERA) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, kGregorianEpoch);
    } else {
        UErrorCode status = U_ZERO_ERROR;
        int32_t eraStartYear = gJapaneseEraRules->getStartYear(internalGet(UCAL_ERA, gCurrentEra), status);
        U_ASSERT(U_SUCCESS(status));

        // extended year is a gregorian year, where 1 = 1AD,  0 = 1BC, -1 = 2BC, etc
        year = internalGet(UCAL_YEAR, 1)    // pin to minimum of year 1 (first year)
            + eraStartYear                  // add gregorian starting year
            - 1;                            // Subtract one because year starts at 1
    }
    return year;
}